

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O3

dlep_local_neighbor *
dlep_session_add_local_neighbor(dlep_session *session,oonf_layer2_neigh_key *key)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  dlep_local_neighbor *pdVar9;
  
  lVar8 = avl_find(&session->local_neighbor_tree);
  if (lVar8 == 0) {
    if (((key->link_id_length == 0) || ((session->cfg).lid_length == (uint)key->link_id_length)) &&
       (pdVar9 = (dlep_local_neighbor *)oonf_class_malloc(&_local_neighbor_class),
       pdVar9 != (dlep_local_neighbor *)0x0)) {
      *(undefined4 *)((pdVar9->key).link_id + 0xc) = *(undefined4 *)(key->link_id + 0xc);
      uVar1 = *(undefined4 *)(key->addr)._addr;
      uVar2 = *(undefined4 *)((key->addr)._addr + 4);
      uVar3 = *(undefined4 *)((key->addr)._addr + 8);
      uVar4 = *(undefined4 *)((key->addr)._addr + 0xc);
      uVar5 = *(undefined4 *)(key->link_id + 1);
      uVar6 = *(undefined4 *)(key->link_id + 5);
      uVar7 = *(undefined4 *)(key->link_id + 9);
      *(undefined4 *)&(pdVar9->key).addr._type = *(undefined4 *)&(key->addr)._type;
      *(undefined4 *)((pdVar9->key).link_id + 1) = uVar5;
      *(undefined4 *)((pdVar9->key).link_id + 5) = uVar6;
      *(undefined4 *)((pdVar9->key).link_id + 9) = uVar7;
      *(undefined4 *)(pdVar9->key).addr._addr = uVar1;
      *(undefined4 *)((pdVar9->key).addr._addr + 4) = uVar2;
      *(undefined4 *)((pdVar9->key).addr._addr + 8) = uVar3;
      *(undefined4 *)((pdVar9->key).addr._addr + 0xc) = uVar4;
      (pdVar9->_node).key = pdVar9;
      avl_insert(&session->local_neighbor_tree,&pdVar9->_node);
      (pdVar9->_ack_timeout).class = &_destination_ack_class;
      pdVar9->session = session;
      avl_init(&pdVar9->_ip_prefix_modification,avl_comp_netaddr,0);
      return pdVar9;
    }
    pdVar9 = (dlep_local_neighbor *)0x0;
  }
  else {
    pdVar9 = (dlep_local_neighbor *)(lVar8 + -0xe0);
  }
  return pdVar9;
}

Assistant:

struct dlep_local_neighbor *
dlep_session_add_local_neighbor(struct dlep_session *session, const struct oonf_layer2_neigh_key *key) {
  struct dlep_local_neighbor *local;
  if ((local = dlep_session_get_local_neighbor(session, key))) {
    return local;
  }

  if (key->link_id_length != 0 && key->link_id_length != session->cfg.lid_length) {
    /* LIDs not allowed */
    return NULL;
  }
  local = oonf_class_malloc(&_local_neighbor_class);
  if (!local) {
    return NULL;
  }

  /* hook into tree */
  memcpy(&local->key, key, sizeof(*key));
  local->_node.key = &local->key;
  avl_insert(&session->local_neighbor_tree, &local->_node);

  /* initialize timer */
  local->_ack_timeout.class = &_destination_ack_class;

  /* initialize backpointer */
  local->session = session;

  avl_init(&local->_ip_prefix_modification, avl_comp_netaddr, false);

  return local;
}